

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Allocate(BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int **ppBuckets,EntryType **ppEntries,uint bucketCount,int size)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  undefined4 *puVar2;
  undefined1 auVar3 [16];
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  int *__s;
  EntryType *__s_00;
  size_t requestedBytes;
  undefined8 *in_FS_OFFSET;
  
  if (bucketCount == 0) {
    __s = (int *)0x8;
  }
  else {
    pAVar1 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_002d0304;
      *puVar2 = 0;
    }
    __s = (int *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(pAVar1,(ulong)bucketCount * 4);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) goto LAB_002d0304;
      *puVar2 = 0;
    }
  }
  if (__s == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x46b,"(buckets)","buckets");
    if (!bVar5) goto LAB_002d0304;
    *puVar2 = 0;
  }
  if (size == 0) {
    __s_00 = (EntryType *)0x8;
  }
  else {
    pAVar1 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)size;
    requestedBytes = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
      requestedBytes = SUB168(auVar3 * ZEXT816(0x18),0);
    }
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_002d0304;
      *puVar2 = 0;
    }
    if (requestedBytes == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar5) goto LAB_002d0304;
      *puVar2 = 0;
    }
    __s_00 = (EntryType *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(pAVar1,requestedBytes);
    memset(__s_00,0,requestedBytes);
    memset((char *)((long)&(__s_00->
                           super_DefaultHashedEntry<char16_t_*,_ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           ).super_KeyValueEntry<char16_t_*,_ArenaMemoryDataSummary_*>.
                           super_ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
                           .super_KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>.
                           value + requestedBytes),0,
           (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
    if (__s_00 == (EntryType *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) goto LAB_002d0304;
      *puVar2 = 0;
    }
  }
  if (__s_00 == (EntryType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x471,"(entries)","entries");
    if (!bVar5) {
LAB_002d0304:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  memset(__s,0xff,(ulong)bucketCount << 2);
  *ppBuckets = __s;
  *ppEntries = __s_00;
  return;
}

Assistant:

void Allocate(__deref_out_ecount(bucketCount) int** ppBuckets, __deref_out_ecount(size) EntryType** ppEntries, DECLSPEC_GUARD_OVERFLOW uint bucketCount, DECLSPEC_GUARD_OVERFLOW int size)
        {
            int *const buckets = AllocateBuckets(bucketCount);
            Assert(buckets); // no-throw allocators are currently not supported

            EntryType *entries;
            try
            {
                entries = AllocateEntries(size);
                Assert(entries); // no-throw allocators are currently not supported
            }
            catch(...)
            {
                DeleteBuckets(buckets, bucketCount);
                throw;
            }

            memset(buckets, -1, bucketCount * sizeof(buckets[0]));

            *ppBuckets = buckets;
            *ppEntries = entries;
        }